

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeExponent(ParsedPatternInfo *this,UErrorCode *status)

{
  ParserState *this_00;
  ParsedSubpatternInfo *pPVar1;
  UChar32 UVar2;
  uint uVar3;
  
  pPVar1 = this->currentSubpattern;
  this_00 = &this->state;
  UVar2 = ParserState::peek(this_00);
  if (UVar2 == 0x45) {
    if ((~(uint)pPVar1->groupingSizes & 0xffff0000) == 0) {
      uVar3 = ParserState::peek(this_00);
      (this->state).offset = ((this->state).offset - (uint)(uVar3 < 0x10000)) + 2;
      pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
      UVar2 = ParserState::peek(this_00);
      if (UVar2 != 0x2b) goto LAB_00265c4c;
      uVar3 = ParserState::peek(this_00);
      (this->state).offset = ((this->state).offset - (uint)(uVar3 < 0x10000)) + 2;
      pPVar1->exponentHasPlusSign = true;
      while( true ) {
        pPVar1->widthExceptAffixes = pPVar1->widthExceptAffixes + 1;
LAB_00265c4c:
        UVar2 = ParserState::peek(this_00);
        if (UVar2 != 0x30) break;
        uVar3 = ParserState::peek(this_00);
        (this->state).offset = ((this->state).offset - (uint)(uVar3 < 0x10000)) + 2;
        pPVar1->exponentZeros = pPVar1->exponentZeros + 1;
      }
    }
    else {
      *status = U_MALFORMED_EXPONENTIAL_PATTERN;
    }
  }
  return;
}

Assistant:

void ParsedPatternInfo::consumeExponent(UErrorCode& status) {
    // Convenience reference:
    ParsedSubpatternInfo& result = *currentSubpattern;

    if (state.peek() != u'E') {
        return;
    }
    if ((result.groupingSizes & 0xffff0000L) != 0xffff0000L) {
        state.toParseException(u"Cannot have grouping separator in scientific notation");
        status = U_MALFORMED_EXPONENTIAL_PATTERN;
        return;
    }
    state.next(); // consume the E
    result.widthExceptAffixes++;
    if (state.peek() == u'+') {
        state.next(); // consume the +
        result.exponentHasPlusSign = true;
        result.widthExceptAffixes++;
    }
    while (state.peek() == u'0') {
        state.next(); // consume the 0
        result.exponentZeros += 1;
        result.widthExceptAffixes++;
    }
}